

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization_helper.h
# Opt level: O0

void serialization::unserialize_helper<serialization::json_iarchive,Person>
               (json_iarchive *ar,vector<Person,_std::allocator<Person>_> *v)

{
  undefined1 local_50 [8];
  Person tmp;
  size_type i;
  size_type size;
  vector<Person,_std::allocator<Person>_> *pvStack_18;
  serialization_trace trace;
  vector<Person,_std::allocator<Person>_> *v_local;
  json_iarchive *ar_local;
  
  i = 0xa8;
  pvStack_18 = v;
  serialization_trace::serialization_trace<char_const(&)[19],char_const(&)[140],int>
            ((serialization_trace *)((long)&size + 3),(char (*) [19])"unserialize_helper",
             (char (*) [140])
             "/workspace/llm4binary/github/license_c_cmakelists/avplayer[P]serialization2/examples/../include/serialization/detail/serialization_helper.h"
             ,(int *)&i);
  tmp._36_4_ = json_iarchive::load_sequence_start(ar);
  std::vector<Person,_std::allocator<Person>_>::reserve(pvStack_18,(ulong)(uint)tmp._36_4_);
  for (tmp.age = 0; (uint)tmp.age < (uint)tmp._36_4_; tmp.age = tmp.age + 1) {
    json_iarchive::load_sequence_item_start(ar,tmp.age);
    Person::Person((Person *)local_50);
    unserialize_helper<serialization::json_iarchive,Person>(ar,(Person *)local_50);
    std::vector<Person,_std::allocator<Person>_>::push_back(pvStack_18,(value_type *)local_50);
    json_iarchive::load_sequence_item_end(ar);
    Person::~Person((Person *)local_50);
  }
  json_iarchive::load_sequence_end(ar);
  return;
}

Assistant:

inline void unserialize_helper(const Archive & ar, std::vector<T> & v)
{
	serialization_trace trace(__func__, __FILE__, __LINE__);

    auto size = ar.load_sequence_start();
    v.reserve(size);
    for(size_type i = 0; i < size; ++i)
    {
        ar.load_sequence_item_start(i);
        T tmp;
        unserialize_helper(ar, tmp);
        v.push_back(std::move(tmp));
        ar.load_sequence_item_end();
    }

    ar.load_sequence_end();
}